

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O1

void __thiscall deci::program_t::~program_t(program_t *this)

{
  ~program_t(this);
  operator_delete(this);
  return;
}

Assistant:

program_t::~program_t() {
    result->Delete();
    for (auto command: this->source)
    {
      command.arg->Delete();
    }
  }